

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  ZSTD_Sequence *pZVar1;
  BYTE BVar2;
  ZSTD_sequenceFormat_e ZVar3;
  uint uVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  size_t err_code;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long_long uVar14;
  uint *puVar15;
  short *psVar16;
  ulong uVar17;
  code *pcVar18;
  ulong uVar19;
  size_t err_code_1;
  BYTE *op;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined8 uVar23;
  ulong local_48 [3];
  
  sVar10 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar10 < 0xffffffffffffff89) {
    sVar11 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    ZVar3 = (cctx->appliedParams).blockDelimiters;
    uVar17 = 0;
    pcVar18 = (code *)0x0;
    if (ZVar3 == ZSTD_sf_noBlockDelimiters) {
      pcVar18 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    if (ZVar3 == ZSTD_sf_explicitBlockDelimiters) {
      pcVar18 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    }
    psVar16 = (short *)((long)dst + sVar11);
    uVar20 = dstCapacity - sVar11;
    uVar23 = 0xffffffffffffffba;
    uVar19 = uVar20;
    if (srcSize == 0) {
      if (uVar20 < 4) {
        return 0xffffffffffffffba;
      }
      psVar16[0] = 1;
      psVar16[1] = 0;
      psVar16 = (short *)((long)psVar16 + 3);
      uVar23 = 3;
      uVar17 = 3;
      uVar19 = uVar20 - 3;
    }
    for (; srcSize != 0; srcSize = srcSize - uVar21) {
      uVar13 = cctx->blockSize;
      if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
        uVar21 = uVar13;
        if (srcSize < uVar13) {
          uVar21 = srcSize;
        }
        bVar22 = srcSize <= uVar13;
        if (0xffffffffffffff88 < uVar21) {
          return uVar21;
        }
      }
      else {
        puVar15 = &inSeqs[local_48[0] & 0xffffffff].matchLength;
        uVar12 = (local_48[0] & 0xffffffff) - 1;
        uVar21 = 0;
        do {
          uVar12 = uVar12 + 1;
          if (inSeqsSize <= uVar12) {
            return 0xffffffffffffff95;
          }
          uVar4 = *puVar15;
          uVar21 = uVar21 + (puVar15[-1] + uVar4);
          pZVar1 = (ZSTD_Sequence *)(puVar15 + -2);
          puVar15 = puVar15 + 4;
        } while (pZVar1->offset != 0);
        uVar23 = 0xffffffffffffff95;
        uVar12 = 0xffffffffffffff95;
        if (uVar4 == 0) {
          uVar12 = uVar21;
        }
        if (0xffffffffffffff88 < uVar12) {
          return uVar12;
        }
        if ((uVar13 < uVar12) || (bVar22 = uVar12 == srcSize, srcSize < uVar12)) {
          return 0xffffffffffffff95;
        }
      }
      (cctx->seqStore).lit = (cctx->seqStore).litStart;
      (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
      (cctx->seqStore).longLengthType = ZSTD_llt_none;
      uVar13 = (*pcVar18)(cctx,local_48,inSeqs,inSeqsSize,src,uVar21,
                          (cctx->appliedParams).searchForExternalRepcodes);
      if (0xffffffffffffff88 < uVar13) {
        return uVar13;
      }
      uVar21 = uVar21 - uVar13;
      sVar7 = (short)uVar21;
      if (uVar21 < 7) {
        uVar13 = uVar21 + 3;
        if (uVar19 < uVar13) {
          return 0xffffffffffffffba;
        }
        *psVar16 = (ushort)bVar22 + sVar7 * 8;
        *(undefined1 *)(psVar16 + 1) = 0;
        uVar23 = 0xf384cc;
        switchD_00916250::default((void *)((long)psVar16 + 3),src,uVar21);
        uVar17 = uVar17 + uVar13;
      }
      else {
        if (uVar19 < 3) {
          return 0xffffffffffffffba;
        }
        sVar10 = ZSTD_entropyCompressSeqStore
                           (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                            &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                            (void *)((long)psVar16 + 3),uVar19 - 3,uVar21,cctx->entropyWorkspace,
                            (ulong)(uint)cctx->bmi2,(int)uVar23);
        if (0xffffffffffffff88 < sVar10) {
          return sVar10;
        }
        uVar8 = (ushort)bVar22;
        if (cctx->isFirstBlock == 0) {
          uVar23 = 0xf385dd;
          iVar9 = ZSTD_maybeRLE(&cctx->seqStore);
          if (iVar9 == 0) goto LAB_00f38559;
          uVar23 = 0xf385f2;
          iVar9 = ZSTD_isRLE((BYTE *)src,uVar21);
          if (iVar9 == 0) goto LAB_00f38559;
LAB_00f385fa:
          if (uVar19 == 3) {
            return 0xffffffffffffffba;
          }
          BVar2 = *src;
          *psVar16 = uVar8 + sVar7 * 8 + 2;
          *(char *)(psVar16 + 1) = (char)(uVar21 >> 0xd);
          *(BYTE *)((long)psVar16 + 3) = BVar2;
          uVar23 = 4;
          uVar13 = 4;
        }
        else {
LAB_00f38559:
          if (sVar10 == 1) goto LAB_00f385fa;
          if (sVar10 == 0) {
            uVar13 = uVar21 + 3;
            if (uVar19 < uVar13) {
              return 0xffffffffffffffba;
            }
            *psVar16 = uVar8 + sVar7 * 8;
            *(char *)(psVar16 + 1) = (char)(uVar21 >> 0xd);
            uVar23 = 0xf385a6;
            switchD_00916250::default((void *)((long)psVar16 + 3),src,uVar21);
            if (0xffffffffffffff88 < uVar13) {
              return uVar13;
            }
          }
          else {
            pZVar5 = (cctx->blockState).prevCBlock;
            pZVar6 = (cctx->blockState).nextCBlock;
            (cctx->blockState).prevCBlock = pZVar6;
            (cctx->blockState).nextCBlock = pZVar5;
            if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            *psVar16 = uVar8 + (short)sVar10 * 8 + 4;
            *(char *)(psVar16 + 1) = (char)(sVar10 >> 0xd);
            uVar13 = sVar10 + 3;
          }
        }
        uVar17 = uVar17 + uVar13;
        if (bVar22 != false) break;
        cctx->isFirstBlock = 0;
      }
      uVar19 = uVar19 - uVar13;
      src = (void *)((long)src + uVar21);
      psVar16 = (short *)((long)psVar16 + uVar13);
    }
    sVar10 = uVar17;
    if ((uVar17 < 0xffffffffffffff89) &&
       (sVar10 = sVar11 + uVar17, (cctx->appliedParams).fParams.checksumFlag != 0)) {
      uVar14 = XXH64_digest(&cctx->xxhState);
      if (uVar20 - uVar17 < 4) {
        sVar10 = 0xffffffffffffffba;
      }
      else {
        *(int *)((long)dst + sVar10) = (int)uVar14;
        sVar10 = sVar10 + 4;
      }
    }
  }
  return sVar10;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}